

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

string * __thiscall
glcts::InterfaceMatchingCase::getTestTypeName_abi_cxx11_
          (string *__return_storage_ptr__,InterfaceMatchingCase *this,TestType testType)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (testType == SET_PRECISION) {
    __s = "explicit precision";
    __a = &local_b;
  }
  else if (testType == SET_DEFAULT_PRECISION) {
    __s = "set default precision";
    __a = &local_a;
  }
  else if (testType == DEFAULT_PRECISION) {
    __s = "use predeclared precision";
    __a = &local_9;
  }
  else {
    __s = fixed_sample_locations_values + 1;
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getTestTypeName(TestType testType)
	{
		switch (testType)
		{
		case DEFAULT_PRECISION:
			return "use predeclared precision";
		case SET_DEFAULT_PRECISION:
			return "set default precision";
		case SET_PRECISION:
			return "explicit precision";
		}
		return "";
	}